

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pFVar5 = (this->left_->fadexpr_).expr_.fadexpr_.right_;
  pdVar6 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar6 = (pFVar5->dx_).ptr_to_data + i;
  }
  dVar1 = (this->left_->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar2 = *pdVar6;
  dVar7 = ::exp(dVar1 * pFVar5->val_);
  dVar8 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar5 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  pdVar6 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar6 = (pFVar5->dx_).ptr_to_data + i;
  }
  dVar3 = (this->right_->fadexpr_).expr_.fadexpr_.left_.constant_;
  dVar4 = *pdVar6;
  dVar9 = cos(dVar3 * pFVar5->val_);
  dVar10 = ::exp((this->left_->fadexpr_).expr_.fadexpr_.left_.constant_ *
                 ((this->left_->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar10 * dVar9 * dVar4 * dVar3 + dVar8 * dVar7 * dVar2 * dVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}